

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::LineStripRenderer<ImPlot::GetterXsYs<long_long>,_ImPlot::TransformerLogLin>::operator()
          (LineStripRenderer<ImPlot::GetterXsYs<long_long>,_ImPlot::TransformerLogLin> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImU32 IVar3;
  uint uVar4;
  GetterXsYs<long_long> *pGVar5;
  TransformerLogLin *pTVar6;
  long lVar7;
  ImPlotPlot *pIVar8;
  ImDrawVert *pIVar9;
  ImDrawVert *pIVar10;
  uint *puVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [12];
  double dVar14;
  ImPlotContext *pIVar15;
  int iVar16;
  long lVar17;
  double dVar18;
  ImVec2 IVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  
  pIVar15 = GImPlot;
  pGVar5 = this->Getter;
  pTVar6 = this->Transformer;
  iVar16 = pGVar5->Count;
  lVar17 = (long)(((pGVar5->Offset + prim + 1) % iVar16 + iVar16) % iVar16) * (long)pGVar5->Stride;
  lVar7 = *(long *)((long)pGVar5->Ys + lVar17);
  dVar18 = log10((double)*(long *)((long)pGVar5->Xs + lVar17) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar8 = pIVar15->CurrentPlot;
  dVar14 = (pIVar8->XAxis).Range.Min;
  iVar16 = pTVar6->YAxis;
  IVar1 = pIVar15->PixelRange[iVar16].Min;
  IVar19.x = (float)(pIVar15->Mx *
                     (((double)(float)(dVar18 / pIVar15->LogDenX) *
                       ((pIVar8->XAxis).Range.Max - dVar14) + dVar14) - dVar14) + (double)IVar1.x);
  IVar19.y = (float)(pIVar15->My[iVar16] * ((double)lVar7 - pIVar8->YAxis[iVar16].Range.Min) +
                    (double)IVar1.y);
  fVar20 = (this->P1).x;
  fVar21 = (this->P1).y;
  auVar25._0_4_ = ~-(uint)(IVar19.x <= fVar20) & (uint)IVar19.x;
  auVar25._4_4_ = ~-(uint)(IVar19.y <= fVar21) & (uint)IVar19.y;
  auVar25._8_4_ = ~-(uint)(fVar20 < IVar19.x) & (uint)IVar19.x;
  auVar25._12_4_ = ~-(uint)(fVar21 < IVar19.y) & (uint)IVar19.y;
  auVar12._4_4_ = (uint)fVar21 & -(uint)(IVar19.y <= fVar21);
  auVar12._0_4_ = (uint)fVar20 & -(uint)(IVar19.x <= fVar20);
  auVar12._8_4_ = (uint)fVar20 & -(uint)(fVar20 < IVar19.x);
  auVar12._12_4_ = (uint)fVar21 & -(uint)(fVar21 < IVar19.y);
  auVar25 = auVar25 | auVar12;
  fVar22 = (cull_rect->Min).y;
  auVar13._4_8_ = auVar25._8_8_;
  auVar13._0_4_ = -(uint)(auVar25._4_4_ < fVar22);
  auVar26._0_8_ = auVar13._0_8_ << 0x20;
  auVar26._8_4_ = -(uint)(auVar25._8_4_ < (cull_rect->Max).x);
  auVar26._12_4_ = -(uint)(auVar25._12_4_ < (cull_rect->Max).y);
  auVar27._4_4_ = -(uint)(fVar22 < auVar25._4_4_);
  auVar27._0_4_ = -(uint)((cull_rect->Min).x < auVar25._0_4_);
  auVar27._8_8_ = auVar26._8_8_;
  iVar16 = movmskps((int)pIVar8,auVar27);
  if (iVar16 == 0xf) {
    IVar3 = this->Col;
    IVar1 = *uv;
    fVar22 = IVar19.x - fVar20;
    fVar23 = IVar19.y - fVar21;
    fVar24 = fVar22 * fVar22 + fVar23 * fVar23;
    if (0.0 < fVar24) {
      fVar24 = 1.0 / SQRT(fVar24);
      fVar22 = fVar22 * fVar24;
      fVar23 = fVar23 * fVar24;
    }
    fVar24 = this->Weight * 0.5;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9->uv = IVar1;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10->col = IVar3;
    fVar22 = fVar24 * fVar22;
    fVar24 = fVar24 * fVar23;
    (pIVar9->pos).x = fVar20 + fVar24;
    (pIVar9->pos).y = fVar21 - fVar22;
    pIVar10[1].pos.x = fVar24 + IVar19.x;
    pIVar10[1].pos.y = IVar19.y - fVar22;
    pIVar10[1].uv = IVar1;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[1].col = IVar3;
    pIVar9[2].pos.x = IVar19.x - fVar24;
    pIVar9[2].pos.y = fVar22 + IVar19.y;
    pIVar9[2].uv = IVar1;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[2].col = IVar3;
    IVar2 = this->P1;
    pIVar9[3].pos.x = IVar2.x - fVar24;
    pIVar9[3].pos.y = IVar2.y + fVar22;
    pIVar9[3].uv.x = IVar1.x;
    pIVar9[3].uv.y = IVar1.y;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[3].col = IVar3;
    DrawList->_VtxWritePtr = pIVar9 + 4;
    uVar4 = DrawList->_VtxCurrentIdx;
    puVar11 = DrawList->_IdxWritePtr;
    *puVar11 = uVar4;
    puVar11[1] = uVar4 + 1;
    puVar11[2] = DrawList->_VtxCurrentIdx + 2;
    uVar4 = DrawList->_VtxCurrentIdx;
    puVar11[3] = uVar4;
    puVar11[4] = uVar4 + 2;
    puVar11[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar11 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  this->P1 = IVar19;
  return (char)iVar16 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        P1 = P2;
        return true;
    }